

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationX.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CRotationX<std::complex<double>_>::CRotationX
          (CRotationX<std::complex<double>_> *this)

{
  undefined4 local_c;
  undefined8 local_8;
  
  (this->super_QControlledGate2<std::complex<double>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<double>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004d0ea8;
  local_c = 1;
  local_8 = 0;
  std::make_unique<qclab::qgates::RotationX<std::complex<double>>,int,double>
            ((int *)&this->gate_,(double *)&local_c);
  return;
}

Assistant:

CRotationX()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< RotationX< T > >( 1 , 0. ) )
        { }